

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_pstream.c
# Opt level: O2

void HTS_PStream_calc_wuw_and_wum(HTS_PStream *pst,size_t m)

{
  double dVar1;
  int iVar2;
  ulong uVar3;
  double *pdVar4;
  ulong uVar5;
  size_t sVar6;
  double *pdVar7;
  double *pdVar8;
  ulong uVar9;
  size_t sVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  double dVar15;
  
  uVar3 = pst->length;
  for (uVar9 = 0; uVar9 != uVar3; uVar9 = uVar9 + 1) {
    pdVar4 = (pst->sm).wum;
    pdVar4[uVar9] = 0.0;
    uVar5 = pst->width;
    for (uVar12 = 0; uVar5 != uVar12; uVar12 = uVar12 + 1) {
      (pst->sm).wuw[uVar9][uVar12] = 0.0;
    }
    sVar6 = pst->win_size;
    for (sVar10 = 0; sVar10 != sVar6; sVar10 = sVar10 + 1) {
      lVar14 = (long)pst->win_l_width[sVar10];
      iVar2 = pst->win_r_width[sVar10];
      lVar13 = lVar14 * -8;
      for (; lVar14 <= iVar2; lVar14 = lVar14 + 1) {
        uVar12 = lVar14 + (int)uVar9;
        if (uVar12 < uVar3 && -1 < (long)uVar12) {
          pdVar7 = pst->win_coefficient[sVar10];
          dVar15 = pdVar7[-lVar14];
          if ((dVar15 != 0.0) || (NAN(dVar15))) {
            lVar11 = pst->vector_length * sVar10 + m;
            dVar15 = dVar15 * (pst->sm).ivar[uVar9 + lVar14][lVar11];
            pdVar4[uVar9] = (pst->sm).mean[uVar9 + lVar14][lVar11] * dVar15 + pdVar4[uVar9];
            lVar11 = 0;
            for (uVar12 = 0; (uVar12 < uVar5 && (uVar9 + uVar12 < uVar3)); uVar12 = uVar12 + 1) {
              if (lVar11 >> 0x20 <= lVar14 + iVar2) {
                dVar1 = *(double *)((long)pdVar7 + uVar12 * 8 + lVar13);
                if ((dVar1 != 0.0) || (NAN(dVar1))) {
                  pdVar8 = (pst->sm).wuw[uVar9];
                  pdVar8[uVar12] = dVar1 * dVar15 + pdVar8[uVar12];
                }
              }
              lVar11 = lVar11 + 0x100000000;
            }
          }
        }
        lVar13 = lVar13 + -8;
      }
    }
  }
  return;
}

Assistant:

static void HTS_PStream_calc_wuw_and_wum(HTS_PStream * pst, size_t m)
{
   size_t t, i, j;
   int shift;
   double wu;

   for (t = 0; t < pst->length; t++) {
      /* initialize */
      pst->sm.wum[t] = 0.0;
      for (i = 0; i < pst->width; i++)
         pst->sm.wuw[t][i] = 0.0;

      /* calc WUW & WUM */
      for (i = 0; i < pst->win_size; i++)
         for (shift = pst->win_l_width[i]; shift <= pst->win_r_width[i]; shift++)
            if (((int) t + shift >= 0) && ((int) t + shift < pst->length) && (pst->win_coefficient[i][-shift] != 0.0)) {
               wu = pst->win_coefficient[i][-shift] * pst->sm.ivar[t + shift][i * pst->vector_length + m];
               pst->sm.wum[t] += wu * pst->sm.mean[t + shift][i * pst->vector_length + m];
               for (j = 0; (j < pst->width) && (t + j < pst->length); j++)
                  if (((int) j <= pst->win_r_width[i] + shift) && (pst->win_coefficient[i][j - shift] != 0.0))
                     pst->sm.wuw[t][j] += wu * pst->win_coefficient[i][j - shift];
            }
   }
}